

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_shared.h
# Opt level: O0

QByteArray * escapeDependencyPath<QByteArray>(QByteArray *path)

{
  char cVar1;
  qsizetype qVar2;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  int backwards_it;
  int i;
  int size;
  QByteArray *escapedPath;
  uint7 in_stack_ffffffffffffffc8;
  char in_stack_ffffffffffffffcf;
  bool ch;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar4;
  QByteArray *asize;
  
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  asize = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x137299);
  qVar2 = QByteArray::size(in_RSI);
  QByteArray::reserve((QByteArray *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (qsizetype)asize);
  for (iVar4 = 0; iVar4 < (int)qVar2; iVar4 = iVar4 + 1) {
    cVar1 = QByteArray::operator[]
                      ((QByteArray *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                       0x1372db);
    if (cVar1 == '$') {
      QByteArray::append(in_RDI,in_stack_ffffffffffffffcf);
    }
    else {
      cVar1 = QByteArray::operator[]
                        ((QByteArray *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)
                         ,0x137306);
      if (cVar1 == '#') {
        QByteArray::append(in_RDI,in_stack_ffffffffffffffcf);
      }
      else {
        cVar1 = QByteArray::operator[]
                          ((QByteArray *)
                           CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0x137331);
        if (cVar1 == ' ') {
          QByteArray::append(in_RDI,in_stack_ffffffffffffffcf);
          iVar3 = iVar4;
          while( true ) {
            iVar3 = iVar3 + -1;
            ch = false;
            if (0 < iVar3) {
              cVar1 = QByteArray::operator[]
                                ((QByteArray *)(ulong)in_stack_ffffffffffffffc8,0x13736f);
              ch = cVar1 == '\\';
            }
            if (ch == false) break;
            QByteArray::append(in_RDI,ch);
          }
          in_stack_ffffffffffffffcf = '\0';
        }
      }
    }
    QByteArray::operator[]
              ((QByteArray *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0x1373b7)
    ;
    QByteArray::append(in_RDI,in_stack_ffffffffffffffcf);
  }
  return in_RDI;
}

Assistant:

StringType escapeDependencyPath(const StringType &path)
{
    using CT = typename CharType<StringType>::type;
    StringType escapedPath;
    int size = path.size();
    escapedPath.reserve(size);
    for (int i = 0; i < size; ++i) {
        if (path[i] == CT('$')) {
            escapedPath.append(CT('$'));
        } else if (path[i] == CT('#')) {
            escapedPath.append(CT('\\'));
        } else if (path[i] == CT(' ')) {
            escapedPath.append(CT('\\'));
            int backwards_it = i - 1;
            while (backwards_it > 0 && path[backwards_it] == CT('\\')) {
                escapedPath.append(CT('\\'));
                --backwards_it;
            }
        }
        escapedPath.append(path[i]);
    }
    return escapedPath;
}